

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_data.cpp
# Opt level: O0

void __thiscall YAML::detail::node_data::reset_map(node_data *this)

{
  list<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
  *in_RDI;
  
  std::
  vector<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
  ::clear((vector<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
           *)0xf0851f);
  std::__cxx11::
  list<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
  ::clear(in_RDI);
  return;
}

Assistant:

void node_data::reset_map() {
  m_map.clear();
  m_undefinedPairs.clear();
}